

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>
* __thiscall
poly::vector_impl::
allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>
::copy_assign_impl(allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>
                   *this,allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>
                         *a)

{
  pointer puVar1;
  allocator_type *paVar2;
  difference_type dVar3;
  size_t n;
  Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>
  local_29;
  pointer puStack_28;
  allocator_type a_copy;
  pointer s;
  allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>
  *a_local;
  allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>
  *this_local;
  
  puStack_28 = (pointer)0x0;
  paVar2 = get_allocator_ref(a);
  custom::
  Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>
  ::Allocator(&local_29,paVar2);
  dVar3 = size(a);
  if (dVar3 != 0) {
    n = size(a);
    puStack_28 = custom::
                 Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>
                 ::allocate(&local_29,n);
  }
  tidy(this);
  get_allocator_ref(this);
  puVar1 = puStack_28;
  this->_storage = puStack_28;
  dVar3 = size(a);
  this->_end_storage = puVar1 + dVar3;
  custom::
  Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>
  ::~Allocator(&local_29);
  return this;
}

Assistant:

allocator_base& copy_assign_impl(const allocator_base& a, std::true_type /*unused*/)
        {
            static_assert(std::is_nothrow_copy_assignable<allocator_type>::value,
                "allocator copy assignment must not throw");
            pointer s      = nullptr;
            auto    a_copy = a.get_allocator_ref();
            if (a.size()) {
                s = a_copy.allocate(a.size());
            }
            tidy();
            get_allocator_ref() = std::move(a_copy);
            _storage            = s;
            _end_storage        = s + a.size();
            return *this;
        }